

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O1

int oonf_log_init(oonf_appdata *data,oonf_log_severity def_severity)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  oonf_log_severity oVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  
  _appdata = data;
  _libdata = oonf_libdata_get();
  _source_count = 6;
  _handler_list.prev = &_handler_list;
  _handler_list.next = &_handler_list;
  iVar2 = abuf_init(&_logbuffer);
  if (iVar2 == 0) {
    _max_severitytext_len = 0;
    uVar7 = 1;
    uVar5 = 0;
    do {
      uVar6 = (uint)uVar7;
      sVar3 = strlen(LOG_SEVERITY_NAMES[uVar7]);
      if (uVar5 < sVar3) {
        uVar5 = sVar3;
        _max_severitytext_len = sVar3;
      }
      uVar7 = (ulong)(uVar6 * 2);
    } while (uVar6 < 5);
    _max_sourcetext_len = 0;
    lVar8 = 0;
    uVar5 = 0;
    do {
      sVar3 = strlen(*(char **)((long)LOG_SOURCE_NAMES + lVar8));
      if (uVar5 < sVar3) {
        uVar5 = sVar3;
        _max_sourcetext_len = sVar3;
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x30);
    _default_mask = '\0';
    bVar1 = 0;
    oVar4 = LOG_SEVERITY_DEBUG;
    do {
      if (def_severity <= oVar4) {
        bVar1 = bVar1 | (byte)oVar4;
        _default_mask = bVar1;
      }
      bVar9 = oVar4 < (LOG_SEVERITY_WARN|LOG_SEVERITY_DEBUG);
      oVar4 = oVar4 * 2;
    } while (bVar9);
    auVar10 = pshuflw(ZEXT216(CONCAT11(_default_mask,_default_mask)),
                      ZEXT216(CONCAT11(_default_mask,_default_mask)),0);
    log_global_mask._0_4_ = auVar10._0_4_;
    iVar2 = 0;
    log_global_mask._4_4_ = log_global_mask._0_4_;
    log_global_mask._8_4_ = log_global_mask._0_4_;
    log_global_mask._12_4_ = log_global_mask._0_4_;
    log_global_mask._16_4_ = log_global_mask._0_4_;
    log_global_mask._20_4_ = log_global_mask._0_4_;
    log_global_mask._24_4_ = log_global_mask._0_4_;
    log_global_mask._28_4_ = log_global_mask._0_4_;
    log_global_mask._32_4_ = log_global_mask._0_4_;
    log_global_mask._36_4_ = log_global_mask._0_4_;
    log_global_mask._40_4_ = log_global_mask._0_4_;
    log_global_mask._44_4_ = log_global_mask._0_4_;
    log_global_mask._48_4_ = log_global_mask._0_4_;
    log_global_mask._52_4_ = log_global_mask._0_4_;
    log_global_mask._56_4_ = log_global_mask._0_4_;
    log_global_mask._60_4_ = log_global_mask._0_4_;
    log_global_mask._64_4_ = log_global_mask._0_4_;
    log_global_mask._68_4_ = log_global_mask._0_4_;
    log_global_mask._72_4_ = log_global_mask._0_4_;
    log_global_mask._76_4_ = log_global_mask._0_4_;
    log_global_mask._80_4_ = log_global_mask._0_4_;
    log_global_mask._84_4_ = log_global_mask._0_4_;
    log_global_mask._88_4_ = log_global_mask._0_4_;
    log_global_mask._92_4_ = log_global_mask._0_4_;
    log_global_mask._96_4_ = log_global_mask._0_4_;
    log_global_mask._100_4_ = log_global_mask._0_4_;
    log_global_mask._104_4_ = log_global_mask._0_4_;
    log_global_mask._108_4_ = log_global_mask._0_4_;
    log_global_mask._112_4_ = log_global_mask._0_4_;
    log_global_mask._116_4_ = log_global_mask._0_4_;
    log_global_mask._120_4_ = log_global_mask._0_4_;
    log_global_mask._124_4_ = log_global_mask._0_4_;
    memset(_log_warnings,0,0x200);
  }
  else {
    oonf_log_init_cold_1();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
oonf_log_init(const struct oonf_appdata *data, enum oonf_log_severity def_severity) {
  enum oonf_log_severity sev;
  enum oonf_log_source src;
  size_t len;

  _appdata = data;
  _libdata = oonf_libdata_get();
  _source_count = LOG_CORESOURCE_COUNT;

  list_init_head(&_handler_list);

  if (abuf_init(&_logbuffer)) {
    fputs("Not enough memory for logging buffer\n", stderr);
    return -1;
  }

  /* initialize maximum severity length */
  _max_severitytext_len = 0;
  OONF_FOR_ALL_LOGSEVERITIES(sev) {
    len = strlen(LOG_SEVERITY_NAMES[sev]);
    if (len > _max_severitytext_len) {
      _max_severitytext_len = len;
    }
  }

  /* initialize maximum source length */
  _max_sourcetext_len = 0;
  for (src = 0; src < LOG_CORESOURCE_COUNT; src++) {
    len = strlen(LOG_SOURCE_NAMES[src]);
    if (len > _max_sourcetext_len) {
      _max_sourcetext_len = len;
    }
  }

  /* set default mask */
  _default_mask = 0;
  OONF_FOR_ALL_LOGSEVERITIES(sev) {
    if (sev >= def_severity) {
      _default_mask |= sev;
    }
  }

  /* clear global mask */
  memset(&log_global_mask, _default_mask, sizeof(log_global_mask));

  /* clear warning counter */
  memset(_log_warnings, 0, sizeof(_log_warnings));
  return 0;
}